

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

void __thiscall
pfederc::SafeExpr::SafeExpr
          (SafeExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr)

{
  Expr *pEVar1;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__TokenExpr_001286c8;
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_SAFE;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = pos->startIndex;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__SafeExpr_001288f8;
  (this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (expr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (expr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  pEVar1 = (this->expr)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar1 != (Expr *)0x0) {
    pEVar1->parent = &this->super_Expr;
    return;
  }
  __assert_fail("!!this->expr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x256,
                "pfederc::SafeExpr::SafeExpr(const Lexer &, const Position &, std::unique_ptr<Expr> &&)"
               );
}

Assistant:

Expr::Expr(const Lexer &lexer, ExprType type, const Position &pos) noexcept
    : parent{nullptr}, lexer{lexer}, type{type}, pos(pos) {

}